

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLoadUnstructured.hpp
# Opt level: O2

void testApproxL2<makeTests(TasGrid::TypeAcceleration,int)::__16>
               (TasmanianSparseGrid *grid,uint param_2)

{
  BaseCanonicalGrid *pBVar1;
  double dVar2;
  ostream *poVar3;
  runtime_error *this;
  ulong uVar4;
  double *extraout_RDX;
  double *y_00;
  double *extraout_RDX_00;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  allocator_type local_129;
  vector<double,_std::allocator<double>_> transform_a;
  vector<double,_std::allocator<double>_> surrogate;
  vector<double,_std::allocator<double>_> x;
  vector<double,_std::allocator<double>_> transform_b;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  local_98;
  vector<double,_std::allocator<double>_> y;
  minstd_rand park_miller;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar4 = (ulong)param_2;
  surrogate.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xbfe0000000000000;
  surrogate.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xbfe0000000000000;
  surrogate.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xbfe0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&surrogate;
  std::vector<double,_std::allocator<double>_>::vector(&local_98.first,__l,(allocator_type *)&x);
  transform_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3fe6666666666666;
  transform_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3fe6666666666666;
  transform_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3fe6666666666666;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&transform_b;
  std::vector<double,_std::allocator<double>_>::vector(&transform_a,__l_00,(allocator_type *)&y);
  TasGrid::TasmanianSparseGrid::setDomainTransform((vector *)grid,(vector *)&local_98);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&transform_a.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_98);
  pBVar1 = (grid->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 == (BaseCanonicalGrid *)0x0) {
    lVar9 = 0;
    lVar6 = 0;
  }
  else {
    lVar9 = (long)*(int *)(pBVar1 + 0x10);
    lVar6 = (long)*(int *)(pBVar1 + 0x14);
  }
  transform_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  transform_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  transform_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  transform_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  transform_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  transform_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  TasGrid::TasmanianSparseGrid::getDomainTransform((vector *)grid,(vector *)&transform_a);
  surrogate.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&park_miller;
  park_miller._M_x = 0x2a;
  surrogate.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_48;
  local_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0x3ff00000;
  surrogate.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/Addons/testLoadUnstructured.hpp:74:81)>
                ::_M_manager;
  TasDREAM::genUniformSamples
            (&x,&transform_a,&transform_b,param_2,(function<double_()> *)&surrogate);
  std::_Function_base::~_Function_base((_Function_base *)&surrogate);
  std::vector<double,_std::allocator<double>_>::vector(&y,(int)param_2 * lVar6,&local_129);
  uVar7 = 0;
  uVar8 = (ulong)param_2;
  if ((int)param_2 < 1) {
    uVar8 = uVar7;
  }
  lVar5 = 0;
  y_00 = extraout_RDX;
  while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
    makeTests::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)
               ((long)x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar7),
               (double *)
               ((long)y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar5),y_00,(int)uVar4);
    lVar5 = lVar5 + lVar6 * 8;
    uVar7 = uVar7 + lVar9 * 8;
    y_00 = extraout_RDX_00;
  }
  local_98.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
  local_98.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_finish;
  local_98.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage =
       x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_98.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_98.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&y.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&transform_b.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&transform_a.super__Vector_base<double,_std::allocator<double>_>);
  TasGrid::loadUnstructuredDataL2(&local_98.first,&local_98.second,1e-08,grid);
  surrogate.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  surrogate.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  surrogate.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  TasGrid::TasmanianSparseGrid::evaluateBatch<double>((vector *)grid,(vector *)&local_98);
  dVar2 = vecDifference(&local_98.second,&surrogate);
  lVar6 = std::cout;
  if (dVar2 <= 0.0001) {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&surrogate.super__Vector_base<double,_std::allocator<double>_>);
    std::
    pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
    ::~pair(&local_98);
    return;
  }
  *(uint *)(TasGrid::OneDimensionalMeta::isNonNested + *(long *)(std::cout + -0x18)) =
       *(uint *)(TasGrid::OneDimensionalMeta::isNonNested + *(long *)(std::cout + -0x18)) &
       0xfffffefb | 0x100;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar6 + -0x18)) = 10;
  std::operator<<((ostream *)&std::cout,"Failed approximate unstructured construction\n");
  std::operator<<((ostream *)&std::cout,"Observed error: ");
  poVar3 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar3,"  tolerance: ");
  poVar3 = std::ostream::_M_insert<double>(0.0001);
  std::operator<<(poVar3,"\n");
  TasGrid::TasmanianSparseGrid::printStats((ostream *)grid);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"test failed");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void testApproxL2(TasmanianSparseGrid &&grid, CallableModel model, int num_samples, double tolerance){
    grid.setDomainTransform({-0.5, -0.5, -0.5,}, {0.7, 0.7, 0.7});

    auto data = generateRandomData(grid, model, num_samples);
    loadUnstructuredDataL2(data.first, data.second, 1.E-8, grid);

    std::vector<double> surrogate;
    grid.evaluateBatch(data.first, surrogate);

    double err = vecDifference(data.second, surrogate);
    if (err > tolerance){
        std::cout << std::scientific;
        std::cout.precision(10);
        cout << "Failed approximate unstructured construction\n";
        cout << "Observed error: " << err << "  tolerance: " << tolerance << "\n";
        grid.printStats();
        throw std::runtime_error("test failed");
    }
}